

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

mraa_boolean_t mraa_file_contains(char *filename,char *content)

{
  char *__filename;
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  mraa_boolean_t mVar3;
  char *line;
  size_t len;
  char *local_38;
  size_t local_30;
  
  mVar3 = 0;
  if (content != (char *)0x0 && filename != (char *)0x0) {
    __filename = mraa_file_unglob(filename);
    if (__filename != (char *)0x0) {
      mVar3 = 0;
      local_30 = 0;
      local_38 = (char *)0x0;
      __stream = fopen(__filename,"r");
      if (__stream != (FILE *)0x0) {
        do {
          _Var1 = getline(&local_38,&local_30,__stream);
          if (_Var1 == -1) {
            mVar3 = 0;
            goto LAB_00108fdd;
          }
          pcVar2 = strstr(local_38,content);
        } while (pcVar2 == (char *)0x0);
        mVar3 = 1;
LAB_00108fdd:
        fclose(__stream);
        free(__filename);
        __filename = local_38;
      }
      free(__filename);
    }
  }
  return mVar3;
}

Assistant:

mraa_boolean_t
mraa_file_contains(const char* filename, const char* content)
{
    mraa_boolean_t found = 0;
    if ((filename == NULL) || (content == NULL)) {
        return 0;
    }

    char* file = mraa_file_unglob(filename);
    if (file != NULL) {
        size_t len = 0;
        char* line = NULL;
        FILE* fh = fopen(file, "r");
        if (fh == NULL) {
            free(file);
            return 0;
        }
        while ((getline(&line, &len, fh) != -1) && (found == 0)) {
            if (strstr(line, content)) {
                found = 1;
                break;
            }
        }
        fclose(fh);
        free(file);
        free(line);
    }
    return found;
}